

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O3

size_t read_features(vw *all,char **line,size_t *num_chars)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  *line = (char *)0x0;
  sVar2 = readto(all->p->input,line,'\n');
  if (sVar2 != 0) {
    *num_chars = sVar2;
    sVar3 = sVar2;
    if ((((2 < sVar2) && (pcVar1 = *line, *pcVar1 == -0x11)) && (pcVar1[1] == -0x45)) &&
       (pcVar1[2] == -0x41)) {
      *line = pcVar1 + 3;
      sVar3 = *num_chars - 3;
      *num_chars = sVar3;
      if (sVar3 == 0) {
        return sVar2;
      }
    }
    if ((*line)[sVar3 - 1] == '\n') {
      sVar3 = sVar3 - 1;
      *num_chars = sVar3;
      if (sVar3 == 0) {
        return sVar2;
      }
    }
    if ((*line)[sVar3 - 1] == '\r') {
      *num_chars = sVar3 - 1;
    }
  }
  return sVar2;
}

Assistant:

size_t read_features(vw* all, char*& line, size_t& num_chars)
{
  line = nullptr;
  size_t num_chars_initial = readto(*(all->p->input), line, '\n');
  if (num_chars_initial < 1)
    return num_chars_initial;
  num_chars = num_chars_initial;
  if (line[0] == '\xef' && num_chars >= 3 && line[1] == '\xbb' && line[2] == '\xbf')
  {
    line += 3;
    num_chars -= 3;
  }
  if (num_chars > 0 && line[num_chars - 1] == '\n')
    num_chars--;
  if (num_chars > 0 && line[num_chars - 1] == '\r')
    num_chars--;
  return num_chars_initial;
}